

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O3

size_t __thiscall wallet::CoinsResult::Size(CoinsResult *this)

{
  long lVar1;
  _Base_ptr p_Var2;
  size_t sVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = 0;
  for (p_Var2 = (this->coins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->coins)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2)) {
    sVar3 = sVar3 + ((long)p_Var2[1]._M_left - (long)p_Var2[1]._M_parent >> 5) * -0x3333333333333333
    ;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return sVar3;
  }
  __stack_chk_fail();
}

Assistant:

size_t CoinsResult::Size() const
{
    size_t size{0};
    for (const auto& it : coins) {
        size += it.second.size();
    }
    return size;
}